

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

int test_poly4(void)

{
  _Alloc_hider _Var1;
  int iVar2;
  ContextTmpl<T5_dd> ctx;
  Context CStack_58;
  
  destructionMark_abi_cxx11_._M_string_length = 0;
  *destructionMark_abi_cxx11_._M_dataplus._M_p = '\0';
  di::ContextTmpl<T5_dd>::ContextTmpl((ContextTmpl<T5_dd> *)&CStack_58);
  di::Context::get<T5>(&CStack_58);
  di::Context::~Context(&CStack_58);
  _Var1 = destructionMark_abi_cxx11_._M_dataplus;
  iVar2 = strcmp("T5_ddT5_dT5",destructionMark_abi_cxx11_._M_dataplus._M_p);
  if (iVar2 != 0) {
    printf("%s:%d expected \"%s\", actual: \"%s\"\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/hoditohod[P]di-light/test.cpp",
           0x11e,"T5_ddT5_dT5",_Var1._M_p);
  }
  return (uint)(iVar2 == 0);
}

Assistant:

std::string run() { return "A"; }